

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

bool __thiscall
ContextSpecificHolder<BitString,_(unsigned_char)'\x82',_(OptionType)0>::Decode
          (ContextSpecificHolder<BitString,_(unsigned_char)__x82_,_(OptionType)0> *this,uchar *pIn,
          size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  out_of_range *this_00;
  
  if (cbIn != 0) {
    if (*pIn == 0x82) {
      bVar1 = DerBase::Decode<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((DerBase *)this,pIn,cbIn,BitString,cbUsed,&(this->innerType).value);
      this->hasData = bVar1;
    }
    else {
      *cbUsed = 0;
      bVar1 = false;
    }
    return bVar1;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Insufficient buffer");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

bool Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
    {
        // If this is an optional type, we could have used
        // all the bytes on the previous item
        if (cbIn == 0)
            throw std::out_of_range("Insufficient buffer");

        if (IsPresent(pIn[0]))
        {
            bool fRet = innerType.Decode(pIn, cbIn, cbUsed);
            hasData = fRet;
            return fRet;
        }

        cbUsed = 0;
        return false;
    }